

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpOneModule(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  cmDocumentation *this_00;
  string mname;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)&this->CurrentArgument);
  this_00 = (cmDocumentation *)&stack0xffffffffffffffa0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 "module/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffc0);
  bVar1 = PrintFiles(this_00,os,(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    std::operator<<(poVar2,"\" to --help-module is not a CMake module.\n");
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneModule(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  if (this->PrintFiles(os, "module/" + mname)) {
    return true;
  }
  // Argument was not a module.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-module is not a CMake module.\n";
  return false;
}